

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autocompact_test.cc
# Opt level: O2

void __thiscall leveldb::AutoCompactTest::DoReads(AutoCompactTest *this,int n)

{
  DB *pDVar1;
  FILE *__stream;
  FilterPolicy *pFVar2;
  char cVar3;
  bool bVar4;
  uint64_t uVar5;
  long *plVar6;
  long lVar7;
  Env *pEVar8;
  uint uVar9;
  Slice *this_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *pcVar10;
  int iVar11;
  Slice *message;
  undefined1 auVar12 [16];
  uint local_11c;
  undefined1 local_115;
  int local_114;
  Slice local_110;
  AssertionResult gtest_ar;
  int64_t final_other_size;
  size_type sStack_c8;
  string limit_key;
  Slice local_90;
  uint local_7c;
  FilterPolicy *local_78;
  ulong local_70;
  _Alloc_hider local_68;
  double dStack_60;
  string value;
  undefined4 extraout_var;
  
  value._M_dataplus._M_p = (pointer)&value.field_2;
  local_114 = n;
  std::__cxx11::string::_M_construct((ulong)&value,'\0');
  for (iVar11 = 0; iVar11 != 0x200; iVar11 = iVar11 + 1) {
    pDVar1 = this->db_;
    local_115 = 0;
    Key_abi_cxx11_(&limit_key,this,iVar11);
    final_other_size = CONCAT71(limit_key._M_dataplus._M_p._1_7_,(char)limit_key._M_dataplus._M_p);
    sStack_c8 = limit_key._M_string_length;
    local_110.data_ = value._M_dataplus._M_p;
    local_110.size_ = value._M_string_length;
    (*pDVar1->_vptr_DB[2])(&local_90,pDVar1,&local_115,&final_other_size,&local_110);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&gtest_ar,
               (char *)&local_11c,(Status *)"db_->Put(WriteOptions(), Key(i), value)");
    Status::~Status((Status *)&local_90);
    std::__cxx11::string::_M_dispose();
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&limit_key);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      iVar11 = 0x41;
      goto LAB_0010acd3;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  DBImpl::TEST_CompactMemTable((DBImpl *)&gtest_ar);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&limit_key,
             (char *)&final_other_size,(Status *)"dbi->TEST_CompactMemTable()");
  Status::~Status((Status *)&gtest_ar);
  if ((char)limit_key._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (limit_key._M_string_length == 0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)limit_key._M_string_length;
    }
    iVar11 = 0x43;
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&limit_key._M_string_length);
    iVar11 = 0;
LAB_0010a78f:
    if (iVar11 != 0x200) {
      pDVar1 = this->db_;
      local_11c = local_11c & 0xffffff00;
      Key_abi_cxx11_(&limit_key,this,iVar11);
      final_other_size = CONCAT71(limit_key._M_dataplus._M_p._1_7_,(char)limit_key._M_dataplus._M_p)
      ;
      sStack_c8 = limit_key._M_string_length;
      (*pDVar1->_vptr_DB[3])(&local_110,pDVar1,&local_11c,&final_other_size);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&gtest_ar,
                 (char *)&local_90,(Status *)"db_->Delete(WriteOptions(), Key(i))");
      Status::~Status((Status *)&local_110);
      std::__cxx11::string::_M_dispose();
      if (gtest_ar.success_ != false) goto code_r0x0010a806;
      testing::Message::Message((Message *)&limit_key);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      iVar11 = 0x47;
LAB_0010acd3:
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&final_other_size,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/autocompact_test.cc"
                 ,iVar11,pcVar10);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&final_other_size,(Message *)&limit_key);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&final_other_size);
      if ((long *)CONCAT71(limit_key._M_dataplus._M_p._1_7_,(char)limit_key._M_dataplus._M_p) !=
          (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(limit_key._M_dataplus._M_p._1_7_,
                                       (char)limit_key._M_dataplus._M_p) + 8))();
      }
      this_01 = &gtest_ar.message_;
      goto LAB_0010ad5b;
    }
    DBImpl::TEST_CompactMemTable((DBImpl *)&gtest_ar);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&limit_key,
               (char *)&final_other_size,(Status *)"dbi->TEST_CompactMemTable()");
    Status::~Status((Status *)&gtest_ar);
    if ((char)limit_key._M_dataplus._M_p != '\0') {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&limit_key._M_string_length);
      uVar9 = 0;
      Key_abi_cxx11_(&limit_key,this,0);
      iVar11 = local_114;
      sStack_c8 = limit_key._M_string_length;
      Key_abi_cxx11_((string *)&gtest_ar,this,local_114);
      local_110.data_ = (char *)gtest_ar._0_8_;
      local_110.size_ =
           (size_t)gtest_ar.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      uVar5 = Size(this,(Slice *)&final_other_size,&local_110);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      Key_abi_cxx11_(&limit_key,this,iVar11);
      final_other_size = (ulong)limit_key._M_dataplus._M_p._1_7_ << 8;
      sStack_c8 = limit_key._M_string_length;
      Key_abi_cxx11_((string *)&gtest_ar,this,0x200);
      local_110.data_ = (char *)gtest_ar._0_8_;
      local_110.size_ =
           (size_t)gtest_ar.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      local_78 = (FilterPolicy *)Size(this,(Slice *)&final_other_size,&local_110);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      Key_abi_cxx11_(&limit_key,this,local_114);
      local_70 = (long)uVar5 / 10;
      while( true ) {
        final_other_size = CONCAT44(final_other_size._4_4_,100);
        local_11c = uVar9;
        testing::internal::CmpHelperLT<int,int>
                  ((internal *)&gtest_ar,"read","100",(int *)&local_11c,(int *)&final_other_size);
        if (gtest_ar.success_ == false) break;
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar.success_ = false;
        gtest_ar._1_7_ = 1;
        iVar11 = (*this->db_->_vptr_DB[6])(this->db_,(string *)&gtest_ar);
        plVar6 = (long *)CONCAT44(extraout_var,iVar11);
        lVar7 = 0x18;
        do {
          (**(code **)(*plVar6 + lVar7))(plVar6);
          cVar3 = (**(code **)(*plVar6 + 0x10))(plVar6);
          if (cVar3 == '\0') break;
          auVar12 = (**(code **)(*plVar6 + 0x40))(plVar6);
          sStack_c8 = auVar12._8_8_;
          final_other_size = auVar12._0_8_;
          Slice::ToString_abi_cxx11_((string *)&gtest_ar,(Slice *)&final_other_size);
          bVar4 = std::operator<((string *)&gtest_ar,&limit_key);
          std::__cxx11::string::_M_dispose();
          lVar7 = 0x30;
        } while (bVar4);
        (**(code **)(*plVar6 + 8))(plVar6);
        pEVar8 = Env::Default();
        (*pEVar8->_vptr_Env[0x16])(pEVar8,1000000);
        Key_abi_cxx11_((string *)&gtest_ar,this,0);
        local_110.data_ = (char *)gtest_ar._0_8_;
        local_110.size_ =
             (size_t)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
        Key_abi_cxx11_((string *)&final_other_size,this,local_114);
        local_90.data_ = (char *)final_other_size;
        local_90.size_ = sStack_c8;
        uVar5 = Size(this,&local_110,&local_90);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        __stream = _stderr;
        local_7c = local_11c + 1;
        auVar12._8_4_ = (int)(uVar5 >> 0x20);
        auVar12._0_8_ = uVar5;
        auVar12._12_4_ = 0x45300000;
        dStack_60 = auVar12._8_8_ - 1.9342813113834067e+25;
        local_68._M_p =
             (pointer)((dStack_60 + ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0))
                      * 9.5367431640625e-07);
        Key_abi_cxx11_((string *)&gtest_ar,this,local_114);
        local_110.data_ = (char *)gtest_ar._0_8_;
        local_110.size_ =
             (size_t)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
        Key_abi_cxx11_((string *)&final_other_size,this,0x200);
        local_90.data_ = (char *)final_other_size;
        local_90.size_ = sStack_c8;
        Size(this,&local_110,&local_90);
        fprintf(__stream,"iter %3d => %7.3f MB [other %7.3f MB]\n",(ulong)local_7c);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        if (uVar5 <= local_70) {
          Key_abi_cxx11_((string *)&gtest_ar,this,local_114);
          local_110.data_ = (char *)gtest_ar._0_8_;
          local_110.size_ =
               (size_t)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
          Key_abi_cxx11_((string *)&final_other_size,this,0x200);
          local_90.data_ = (char *)final_other_size;
          local_90.size_ = sStack_c8;
          uVar5 = Size(this,&local_110,&local_90);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          pFVar2 = local_78;
          local_110.data_ = (char *)(local_78 + 0x20000);
          final_other_size = uVar5;
          testing::internal::CmpHelperLE<long,long>
                    ((internal *)&gtest_ar,"final_other_size","initial_other_size + 1048576",
                     &final_other_size,(long *)&local_110);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_110);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_90,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/autocompact_test.cc"
                       ,0x66,pcVar10);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_90,(Message *)&local_110);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
            if ((FilterPolicy *)local_110.data_ != (FilterPolicy *)0x0) {
              (*(*(_func_int ***)local_110.data_)[1])();
            }
            goto LAB_0010adcb;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          local_110.data_ = (char *)((long)pFVar2 / 5 + -0x100000);
          testing::internal::CmpHelperGE<long,long>
                    ((internal *)&gtest_ar,"final_other_size","initial_other_size / 5 - 1048576",
                     &final_other_size,(long *)&local_110);
          if (gtest_ar.success_ != false) goto LAB_0010adcb;
          testing::Message::Message((Message *)&local_110);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          this_00 = &local_90;
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/autocompact_test.cc"
                     ,0x67,pcVar10);
          message = &local_110;
          goto LAB_0010ada5;
        }
        uVar9 = local_11c + 1;
      }
      testing::Message::Message((Message *)&final_other_size);
      std::operator<<((ostream *)(final_other_size + 0x10),"Taking too long to compact");
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      this_00 = &local_110;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/autocompact_test.cc"
                 ,0x52,pcVar10);
      message = (Slice *)&final_other_size;
LAB_0010ada5:
      testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      if ((long *)message->data_ != (long *)0x0) {
        (**(code **)(*(long *)message->data_ + 8))();
      }
LAB_0010adcb:
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      std::__cxx11::string::_M_dispose();
      goto LAB_0010ad60;
    }
    testing::Message::Message((Message *)&gtest_ar);
    if (limit_key._M_string_length == 0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)limit_key._M_string_length;
    }
    iVar11 = 0x49;
  }
  this_01 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&limit_key._M_string_length;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&final_other_size,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/autocompact_test.cc"
             ,iVar11,pcVar10);
  testing::internal::AssertHelper::operator=((AssertHelper *)&final_other_size,(Message *)&gtest_ar)
  ;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&final_other_size);
  if (gtest_ar._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
  }
LAB_0010ad5b:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_01);
LAB_0010ad60:
  std::__cxx11::string::_M_dispose();
  return;
code_r0x0010a806:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  iVar11 = iVar11 + 1;
  goto LAB_0010a78f;
}

Assistant:

void AutoCompactTest::DoReads(int n) {
  std::string value(kValueSize, 'x');
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);

  // Fill database
  for (int i = 0; i < kCount; i++) {
    ASSERT_LEVELDB_OK(db_->Put(WriteOptions(), Key(i), value));
  }
  ASSERT_LEVELDB_OK(dbi->TEST_CompactMemTable());

  // Delete everything
  for (int i = 0; i < kCount; i++) {
    ASSERT_LEVELDB_OK(db_->Delete(WriteOptions(), Key(i)));
  }
  ASSERT_LEVELDB_OK(dbi->TEST_CompactMemTable());

  // Get initial measurement of the space we will be reading.
  const int64_t initial_size = Size(Key(0), Key(n));
  const int64_t initial_other_size = Size(Key(n), Key(kCount));

  // Read until size drops significantly.
  std::string limit_key = Key(n);
  for (int read = 0; true; read++) {
    ASSERT_LT(read, 100) << "Taking too long to compact";
    Iterator* iter = db_->NewIterator(ReadOptions());
    for (iter->SeekToFirst();
         iter->Valid() && iter->key().ToString() < limit_key; iter->Next()) {
      // Drop data
    }
    delete iter;
    // Wait a little bit to allow any triggered compactions to complete.
    Env::Default()->SleepForMicroseconds(1000000);
    uint64_t size = Size(Key(0), Key(n));
    std::fprintf(stderr, "iter %3d => %7.3f MB [other %7.3f MB]\n", read + 1,
                 size / 1048576.0, Size(Key(n), Key(kCount)) / 1048576.0);
    if (size <= initial_size / 10) {
      break;
    }
  }

  // Verify that the size of the key space not touched by the reads
  // is pretty much unchanged.
  const int64_t final_other_size = Size(Key(n), Key(kCount));
  ASSERT_LE(final_other_size, initial_other_size + 1048576);
  ASSERT_GE(final_other_size, initial_other_size / 5 - 1048576);
}